

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

void ImGui::TableSortSpecsBuild(ImGuiTable *table)

{
  ImU64 *pIVar1;
  ImGuiTableColumn *pIVar2;
  ImGuiTableSortSpecsColumn *pIVar3;
  int column_n;
  long lVar4;
  
  if (table->IsSortSpecsDirty == false) {
    LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui_widgets.cpp"
                ,0x2811,"TableSortSpecsBuild","ImGui ASSERT FAILED: %s","table->IsSortSpecsDirty");
  }
  TableSortSpecsSanitize(table);
  ImVector<ImGuiTableSortSpecsColumn>::resize(&table->SortSpecsData,(int)table->SortSpecsCount);
  (table->SortSpecs).ColumnsMask = 0;
  for (lVar4 = 0; lVar4 < table->ColumnsCount; lVar4 = lVar4 + 1) {
    pIVar2 = ImSpan<ImGuiTableColumn>::operator[](&table->Columns,(int)lVar4);
    if (pIVar2->SortOrder != -1) {
      pIVar3 = ImVector<ImGuiTableSortSpecsColumn>::operator[]
                         (&table->SortSpecsData,(int)pIVar2->SortOrder);
      *(ImGuiID *)pIVar3 = pIVar2->UserID;
      pIVar3[4] = SUB81(lVar4,0);
      pIVar3[5] = (ImGuiTableSortSpecsColumn)pIVar2->SortOrder;
      pIVar3[6] = (ImGuiTableSortSpecsColumn)pIVar2->SortDirection;
      pIVar1 = &(table->SortSpecs).ColumnsMask;
      *pIVar1 = *pIVar1 | 1L << ((byte)SUB81(lVar4,0) & 0x3f);
    }
  }
  (table->SortSpecs).Specs = (table->SortSpecsData).Data;
  (table->SortSpecs).SpecsCount = (table->SortSpecsData).Size;
  table->IsSortSpecsDirty = false;
  table->IsSortSpecsChangedForUser = true;
  return;
}

Assistant:

void ImGui::TableSortSpecsBuild(ImGuiTable* table)
{
    IM_ASSERT(table->IsSortSpecsDirty);
    TableSortSpecsSanitize(table);

    // Write output
    table->SortSpecsData.resize(table->SortSpecsCount);
    table->SortSpecs.ColumnsMask = 0x00;
    for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
    {
        ImGuiTableColumn* column = &table->Columns[column_n];
        if (column->SortOrder == -1)
            continue;
        ImGuiTableSortSpecsColumn* sort_spec = &table->SortSpecsData[column->SortOrder];
        sort_spec->ColumnUserID = column->UserID;
        sort_spec->ColumnIndex = (ImU8)column_n;
        sort_spec->SortOrder = (ImU8)column->SortOrder;
        sort_spec->SortDirection = column->SortDirection;
        table->SortSpecs.ColumnsMask |= (ImU64)1 << column_n;
    }
    table->SortSpecs.Specs = table->SortSpecsData.Data;
    table->SortSpecs.SpecsCount = table->SortSpecsData.Size;

    table->IsSortSpecsDirty = false;
    table->IsSortSpecsChangedForUser = true;
}